

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O2

tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>_>
* __thiscall
meta::impl::
tuple_base<std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul>,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>>
::operator=(tuple_base<std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul>,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>>
            *this,tuple<Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>_>
                  *v)

{
  *(char **)this =
       (v->base).
       super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 8) =
       (v->base).
       super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x10) =
       (v->base).
       super_tuple_value<1UL,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x18) =
       (v->base).
       super_tuple_value<1UL,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x20) =
       (v->base).
       super_tuple_value<2UL,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x28) =
       (v->base).
       super_tuple_value<2UL,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x30) =
       (v->base).
       super_tuple_value<3UL,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x38) =
       (v->base).
       super_tuple_value<3UL,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x40) =
       (v->base).
       super_tuple_value<4UL,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_false>.
       value.m_view.first;
  *(unsigned_long *)(this + 0x48) =
       (v->base).
       super_tuple_value<4UL,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_false>.
       value.m_view.second;
  *(char **)(this + 0x50) =
       (v->base).
       super_tuple_value<5UL,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_false>.value
       .m_view.first;
  *(unsigned_long *)(this + 0x58) =
       (v->base).
       super_tuple_value<5UL,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_false>.value
       .m_view.second;
  return (tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>_>
          *)this;
}

Assistant:

tuple_base& operator=( const tuple< Us... >& v )
        noexcept( seq::is_all< std::is_nothrow_assignable< Ts&, const Us& >::value... >::value )
      {
#ifdef FIXPP_META_FOLD_EXPRESSIONS
        ( tuple_value< Is, Ts >::operator=( get< Is >( v ) ), ... );
#else
        (void)swallow{ ( tuple_value< Is, Ts >::operator=( meta::get< Is >( v ) ), true )..., true };
#endif
        return *this;
      }